

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_external_replayer_linux.hpp
# Opt level: O1

void __thiscall
Fossilize::ExternalReplayer::Impl::start_replayer_process(Impl *this,Options *options,int ctl_fd)

{
  pointer __s;
  int iVar1;
  int *piVar2;
  char **ppcVar3;
  long lVar4;
  ulong uVar5;
  vector<const_char_*,_std::allocator<const_char_*>_> argv;
  vector<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_> implicit_indices;
  sched_param p;
  char whitelist_hex [9];
  char timeout [16];
  char raytracing_range_end [16];
  char raytracing_range_start [16];
  char compute_range_end [16];
  char compute_range_start [16];
  char graphics_range_end [16];
  char graphics_range_start [16];
  char index_name [16];
  char num_thread_holder [16];
  char control_fd_name [16];
  char fd_name [16];
  string self_path;
  char **local_158;
  iterator iStack_150;
  char **local_148;
  vector<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_> local_138;
  char *local_120;
  undefined1 local_111 [25];
  array<char,_16UL> local_f8;
  array<char,_16UL> local_e8;
  array<char,_16UL> local_d8;
  array<char,_16UL> local_c8;
  array<char,_16UL> local_b8;
  array<char,_16UL> local_a8;
  array<char,_16UL> local_98;
  array<char,_16UL> local_88;
  array<char,_16UL> local_78;
  array<char,_16UL> local_68;
  array<char,_16UL> *local_50;
  undefined8 local_48;
  array<char,_16UL> local_40;
  
  sprintf(local_68._M_elems,"%d",(ulong)(uint)this->fd);
  local_50 = &local_40;
  local_48 = 0;
  local_40._M_elems[0] = '\0';
  local_148 = (char **)0x0;
  local_158 = (char **)0x0;
  iStack_150._M_current = (char **)0x0;
  if (options->num_external_replayer_arguments == 0) {
    if (options->external_replayer_path == (char *)0x0) {
      std::__cxx11::string::_M_replace((ulong)&local_50,0,(char *)0x0,0x24dbca);
      local_138.super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = local_50;
      if (iStack_150._M_current == local_148) {
        std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                  ((vector<char_const*,std::allocator<char_const*>> *)&local_158,iStack_150,
                   (char **)&local_138);
      }
      else {
        *iStack_150._M_current = local_50->_M_elems;
        iStack_150._M_current = iStack_150._M_current + 1;
      }
    }
    else {
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_158,(iterator)0x0,
                 &options->external_replayer_path);
    }
  }
  else if (options->num_external_replayer_arguments != 0) {
    lVar4 = 0;
    uVar5 = 0;
    do {
      ppcVar3 = (char **)((long)options->external_replayer_arguments + lVar4);
      if (iStack_150._M_current == local_148) {
        std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
                  ((vector<char_const*,std::allocator<char_const*>> *)&local_158,iStack_150,ppcVar3)
        ;
      }
      else {
        *iStack_150._M_current = *ppcVar3;
        iStack_150._M_current = iStack_150._M_current + 1;
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 8;
    } while (uVar5 < options->num_external_replayer_arguments);
  }
  if (options->num_databases != 0) {
    lVar4 = 0;
    uVar5 = 0;
    do {
      ppcVar3 = (char **)((long)options->databases + lVar4);
      if (iStack_150._M_current == local_148) {
        std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
                  ((vector<char_const*,std::allocator<char_const*>> *)&local_158,iStack_150,ppcVar3)
        ;
      }
      else {
        *iStack_150._M_current = *ppcVar3;
        iStack_150._M_current = iStack_150._M_current + 1;
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 8;
    } while (uVar5 < options->num_databases);
  }
  local_138.super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x23f8cc;
  if (iStack_150._M_current == local_148) {
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_158,iStack_150,
               (char **)&local_138);
  }
  else {
    *iStack_150._M_current = "--master-process";
    iStack_150._M_current = iStack_150._M_current + 1;
  }
  if (options->quiet != false) {
    local_138.super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x23f8be;
    if (iStack_150._M_current == local_148) {
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_158,iStack_150,
                 (char **)&local_138);
    }
    else {
      *iStack_150._M_current = "--quiet-slave";
      iStack_150._M_current = iStack_150._M_current + 1;
    }
  }
  local_138.super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x23f8f8;
  if (iStack_150._M_current == local_148) {
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_158,iStack_150,
               (char **)&local_138);
  }
  else {
    *iStack_150._M_current = "--shmem-fd";
    iStack_150._M_current = iStack_150._M_current + 1;
  }
  if (iStack_150._M_current == local_148) {
    local_138.super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>.
    _M_impl.super__Vector_impl_data._M_start = &local_68;
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_158,iStack_150,
               (char **)&local_138);
  }
  else {
    *iStack_150._M_current = local_68._M_elems;
    iStack_150._M_current = iStack_150._M_current + 1;
  }
  if (-1 < ctl_fd) {
    local_138.super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x23f903;
    if (iStack_150._M_current == local_148) {
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_158,iStack_150,
                 (char **)&local_138);
    }
    else {
      *iStack_150._M_current = "--control-fd";
      iStack_150._M_current = iStack_150._M_current + 1;
    }
    sprintf(local_78._M_elems,"%d",(ulong)(uint)ctl_fd);
    if (iStack_150._M_current == local_148) {
      local_138.super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = &local_78;
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_158,iStack_150,
                 (char **)&local_138);
    }
    else {
      *iStack_150._M_current = local_78._M_elems;
      iStack_150._M_current = iStack_150._M_current + 1;
    }
  }
  if (options->spirv_validate == true) {
    local_138.super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x23f75d;
    if (iStack_150._M_current == local_148) {
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_158,iStack_150,
                 (char **)&local_138);
    }
    else {
      *iStack_150._M_current = "--spirv-val";
      iStack_150._M_current = iStack_150._M_current + 1;
    }
  }
  if (options->num_threads != 0) {
    local_138.super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x23f816;
    if (iStack_150._M_current == local_148) {
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_158,iStack_150,
                 (char **)&local_138);
    }
    else {
      *iStack_150._M_current = "--num-threads";
      iStack_150._M_current = iStack_150._M_current + 1;
    }
    sprintf(local_88._M_elems,"%u",(ulong)options->num_threads);
    if (iStack_150._M_current == local_148) {
      local_138.super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = &local_88;
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_158,iStack_150,
                 (char **)&local_138);
    }
    else {
      *iStack_150._M_current = local_88._M_elems;
      iStack_150._M_current = iStack_150._M_current + 1;
    }
  }
  if (options->on_disk_pipeline_cache != (char *)0x0) {
    local_138.super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x23f769;
    if (iStack_150._M_current == local_148) {
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_158,iStack_150,
                 (char **)&local_138);
    }
    else {
      *iStack_150._M_current = "--on-disk-pipeline-cache";
      iStack_150._M_current = iStack_150._M_current + 1;
    }
    if (iStack_150._M_current == local_148) {
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_158,iStack_150,
                 &options->on_disk_pipeline_cache);
    }
    else {
      *iStack_150._M_current = options->on_disk_pipeline_cache;
      iStack_150._M_current = iStack_150._M_current + 1;
    }
  }
  if (options->on_disk_validation_cache != (char *)0x0) {
    local_138.super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x23f782;
    if (iStack_150._M_current == local_148) {
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_158,iStack_150,
                 (char **)&local_138);
    }
    else {
      *iStack_150._M_current = "--on-disk-validation-cache";
      iStack_150._M_current = iStack_150._M_current + 1;
    }
    if (iStack_150._M_current == local_148) {
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_158,iStack_150,
                 &options->on_disk_validation_cache);
    }
    else {
      *iStack_150._M_current = options->on_disk_validation_cache;
      iStack_150._M_current = iStack_150._M_current + 1;
    }
  }
  if (options->on_disk_validation_whitelist != (char *)0x0) {
    local_138.super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x23f7bc;
    if (iStack_150._M_current == local_148) {
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_158,iStack_150,
                 (char **)&local_138);
    }
    else {
      *iStack_150._M_current = "--on-disk-validation-whitelist";
      iStack_150._M_current = iStack_150._M_current + 1;
    }
    if (iStack_150._M_current == local_148) {
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_158,iStack_150,
                 &options->on_disk_validation_whitelist);
    }
    else {
      *iStack_150._M_current = options->on_disk_validation_whitelist;
      iStack_150._M_current = iStack_150._M_current + 1;
    }
  }
  if (options->on_disk_validation_blacklist != (char *)0x0) {
    local_138.super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x23f79d;
    if (iStack_150._M_current == local_148) {
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_158,iStack_150,
                 (char **)&local_138);
    }
    else {
      *iStack_150._M_current = "--on-disk-validation-blacklist";
      iStack_150._M_current = iStack_150._M_current + 1;
    }
    if (iStack_150._M_current == local_148) {
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_158,iStack_150,
                 &options->on_disk_validation_blacklist);
    }
    else {
      *iStack_150._M_current = options->on_disk_validation_blacklist;
      iStack_150._M_current = iStack_150._M_current + 1;
    }
  }
  if (options->on_disk_replay_whitelist != (char *)0x0) {
    local_138.super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x23f7db;
    if (iStack_150._M_current == local_148) {
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_158,iStack_150,
                 (char **)&local_138);
    }
    else {
      *iStack_150._M_current = "--on-disk-replay-whitelist";
      iStack_150._M_current = iStack_150._M_current + 1;
    }
    if (iStack_150._M_current == local_148) {
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_158,iStack_150,
                 &options->on_disk_replay_whitelist);
    }
    else {
      *iStack_150._M_current = options->on_disk_replay_whitelist;
      iStack_150._M_current = iStack_150._M_current + 1;
    }
    sprintf((char *)local_111,"%x",(ulong)options->on_disk_replay_whitelist_mask);
    local_138.super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x23f7f6;
    if (iStack_150._M_current == local_148) {
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_158,iStack_150,
                 (char **)&local_138);
    }
    else {
      *iStack_150._M_current = "--on-disk-replay-whitelist-mask";
      iStack_150._M_current = iStack_150._M_current + 1;
    }
    if (iStack_150._M_current == local_148) {
      local_138.super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_111;
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_158,iStack_150,
                 (char **)&local_138);
    }
    else {
      *iStack_150._M_current = (char *)local_111;
      iStack_150._M_current = iStack_150._M_current + 1;
    }
  }
  if (options->on_disk_module_identifier != (char *)0x0) {
    local_138.super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x23f8a2;
    if (iStack_150._M_current == local_148) {
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_158,iStack_150,
                 (char **)&local_138);
    }
    else {
      *iStack_150._M_current = "--on-disk-module-identifier";
      iStack_150._M_current = iStack_150._M_current + 1;
    }
    if (iStack_150._M_current == local_148) {
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_158,iStack_150,
                 &options->on_disk_module_identifier);
    }
    else {
      *iStack_150._M_current = options->on_disk_module_identifier;
      iStack_150._M_current = iStack_150._M_current + 1;
    }
  }
  if (options->replayer_cache_path != (char *)0x0) {
    local_138.super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x23f981;
    if (iStack_150._M_current == local_148) {
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_158,iStack_150,
                 (char **)&local_138);
    }
    else {
      *iStack_150._M_current = "--replayer-cache";
      iStack_150._M_current = iStack_150._M_current + 1;
    }
    if (iStack_150._M_current == local_148) {
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_158,iStack_150,
                 &options->replayer_cache_path);
    }
    else {
      *iStack_150._M_current = options->replayer_cache_path;
      iStack_150._M_current = iStack_150._M_current + 1;
    }
  }
  if (options->enable_validation == true) {
    local_138.super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x23f749;
    if (iStack_150._M_current == local_148) {
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_158,iStack_150,
                 (char **)&local_138);
    }
    else {
      *iStack_150._M_current = "--enable-validation";
      iStack_150._M_current = iStack_150._M_current + 1;
    }
  }
  if (options->disable_signal_handler == true) {
    local_138.super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x23f992;
    if (iStack_150._M_current == local_148) {
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_158,iStack_150,
                 (char **)&local_138);
    }
    else {
      *iStack_150._M_current = "--disable-signal-handler";
      iStack_150._M_current = iStack_150._M_current + 1;
    }
  }
  if (options->disable_rate_limiter == true) {
    local_138.super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x23f9ab;
    if (iStack_150._M_current == local_148) {
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_158,iStack_150,
                 (char **)&local_138);
    }
    else {
      *iStack_150._M_current = "--disable-rate-limiter";
      iStack_150._M_current = iStack_150._M_current + 1;
    }
  }
  if (options->null_device == true) {
    local_138.super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x23f94c;
    if (iStack_150._M_current == local_148) {
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_158,iStack_150,
                 (char **)&local_138);
    }
    else {
      *iStack_150._M_current = "--null-device";
      iStack_150._M_current = iStack_150._M_current + 1;
    }
  }
  local_138.super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x23f73a;
  if (iStack_150._M_current == local_148) {
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_158,iStack_150,
               (char **)&local_138);
  }
  else {
    *iStack_150._M_current = "--device-index";
    iStack_150._M_current = iStack_150._M_current + 1;
  }
  sprintf(local_98._M_elems,"%u",(ulong)options->device_index);
  if (iStack_150._M_current == local_148) {
    local_138.super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>.
    _M_impl.super__Vector_impl_data._M_start = &local_98;
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_158,iStack_150,
               (char **)&local_138);
  }
  else {
    *iStack_150._M_current = local_98._M_elems;
    iStack_150._M_current = iStack_150._M_current + 1;
  }
  if (options->use_pipeline_range == true) {
    local_138.super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x23f83b;
    if (iStack_150._M_current == local_148) {
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_158,iStack_150,
                 (char **)&local_138);
    }
    else {
      *iStack_150._M_current = "--graphics-pipeline-range";
      iStack_150._M_current = iStack_150._M_current + 1;
    }
    sprintf(local_a8._M_elems,"%u",(ulong)options->start_graphics_index);
    sprintf(local_b8._M_elems,"%u",(ulong)options->end_graphics_index);
    if (iStack_150._M_current == local_148) {
      local_138.super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = &local_a8;
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_158,iStack_150,
                 (char **)&local_138);
    }
    else {
      *iStack_150._M_current = local_a8._M_elems;
      iStack_150._M_current = iStack_150._M_current + 1;
    }
    if (iStack_150._M_current == local_148) {
      local_138.super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = &local_b8;
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_158,iStack_150,
                 (char **)&local_138);
    }
    else {
      *iStack_150._M_current = local_b8._M_elems;
      iStack_150._M_current = iStack_150._M_current + 1;
    }
    local_138.super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x23f855;
    if (iStack_150._M_current == local_148) {
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_158,iStack_150,
                 (char **)&local_138);
    }
    else {
      *iStack_150._M_current = "--compute-pipeline-range";
      iStack_150._M_current = iStack_150._M_current + 1;
    }
    sprintf(local_c8._M_elems,"%u",(ulong)options->start_compute_index);
    sprintf(local_d8._M_elems,"%u",(ulong)options->end_compute_index);
    if (iStack_150._M_current == local_148) {
      local_138.super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = &local_c8;
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_158,iStack_150,
                 (char **)&local_138);
    }
    else {
      *iStack_150._M_current = local_c8._M_elems;
      iStack_150._M_current = iStack_150._M_current + 1;
    }
    if (iStack_150._M_current == local_148) {
      local_138.super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = &local_d8;
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_158,iStack_150,
                 (char **)&local_138);
    }
    else {
      *iStack_150._M_current = local_d8._M_elems;
      iStack_150._M_current = iStack_150._M_current + 1;
    }
    local_138.super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x23f86e;
    if (iStack_150._M_current == local_148) {
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_158,iStack_150,
                 (char **)&local_138);
    }
    else {
      *iStack_150._M_current = "--raytracing-pipeline-range";
      iStack_150._M_current = iStack_150._M_current + 1;
    }
    sprintf(local_e8._M_elems,"%u",(ulong)options->start_raytracing_index);
    sprintf(local_f8._M_elems,"%u",(ulong)options->end_raytracing_index);
    if (iStack_150._M_current == local_148) {
      local_138.super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = &local_e8;
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_158,iStack_150,
                 (char **)&local_138);
    }
    else {
      *iStack_150._M_current = local_e8._M_elems;
      iStack_150._M_current = iStack_150._M_current + 1;
    }
    if (iStack_150._M_current == local_148) {
      local_138.super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = &local_f8;
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_158,iStack_150,
                 (char **)&local_138);
    }
    else {
      *iStack_150._M_current = local_f8._M_elems;
      iStack_150._M_current = iStack_150._M_current + 1;
    }
  }
  if (options->pipeline_stats_path != (char *)0x0) {
    local_138.super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x23f88a;
    if (iStack_150._M_current == local_148) {
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_158,iStack_150,
                 (char **)&local_138);
    }
    else {
      *iStack_150._M_current = "--enable-pipeline-stats";
      iStack_150._M_current = iStack_150._M_current + 1;
    }
    if (iStack_150._M_current == local_148) {
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_158,iStack_150,
                 &options->pipeline_stats_path);
    }
    else {
      *iStack_150._M_current = options->pipeline_stats_path;
      iStack_150._M_current = iStack_150._M_current + 1;
    }
  }
  if (options->timeout_seconds != 0) {
    local_138.super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x23f95a;
    if (iStack_150._M_current == local_148) {
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_158,iStack_150,
                 (char **)&local_138);
    }
    else {
      *iStack_150._M_current = "--timeout-seconds";
      iStack_150._M_current = iStack_150._M_current + 1;
    }
    __s = (pointer)(local_111 + 9);
    sprintf((char *)__s,"%u",(ulong)options->timeout_seconds);
    if (iStack_150._M_current == local_148) {
      local_138.super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = __s;
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_158,iStack_150,
                 (char **)&local_138);
    }
    else {
      *iStack_150._M_current = (char *)__s;
      iStack_150._M_current = iStack_150._M_current + 1;
    }
  }
  local_138.super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>::resize
            (&local_138,(ulong)options->num_implicit_whitelist_indices);
  if (options->num_implicit_whitelist_indices != 0) {
    lVar4 = 0;
    uVar5 = 0;
    do {
      local_120 = "--implicit-whitelist";
      if (iStack_150._M_current == local_148) {
        std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                  ((vector<char_const*,std::allocator<char_const*>> *)&local_158,iStack_150,
                   &local_120);
      }
      else {
        *iStack_150._M_current = "--implicit-whitelist";
        iStack_150._M_current = iStack_150._M_current + 1;
      }
      sprintf((local_138.
               super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar4,"%u",
              (ulong)options->implicit_whitelist_indices[uVar5]);
      local_120 = (local_138.
                   super__Vector_base<std::array<char,_16UL>,_std::allocator<std::array<char,_16UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar4;
      if (iStack_150._M_current == local_148) {
        std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                  ((vector<char_const*,std::allocator<char_const*>> *)&local_158,iStack_150,
                   &local_120);
      }
      else {
        *iStack_150._M_current = local_120;
        iStack_150._M_current = iStack_150._M_current + 1;
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x10;
    } while (uVar5 < options->num_implicit_whitelist_indices);
  }
  local_120 = (char *)0x0;
  if (iStack_150._M_current == local_148) {
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_158,iStack_150,&local_120);
  }
  else {
    *iStack_150._M_current = (char *)0x0;
    iStack_150._M_current = iStack_150._M_current + 1;
  }
  if ((options->quiet != false) && (iVar1 = open("/dev/null",1), -1 < iVar1)) {
    dup2(iVar1,1);
    dup2(iVar1,2);
    close(iVar1);
  }
  piVar2 = __errno_location();
  *piVar2 = 0;
  if (((options->disable_rate_limiter == false) && (iVar1 = nice(0x13), iVar1 == -1)) &&
     (*piVar2 != 0)) {
    fwrite("Fossilize ERROR: Failed to set nice value for external replayer!\n",0x41,1,_stderr);
  }
  local_120 = (char *)((ulong)local_120 & 0xffffffff00000000);
  iVar1 = sched_setscheduler(0,3,(sched_param *)&local_120);
  if (iVar1 < 0) {
    fwrite("Fossilize ERROR: Failed to set scheduling policy for external replayer!\n",0x48,1,
           _stderr);
  }
  if ((options->disable_rate_limiter == false) && (lVar4 = syscall(0xfb,1,0,0x6000), (int)lVar4 < 0)
     ) {
    fwrite("Fossilize ERROR: Failed to set IO priority for external replayer!\n",0x42,1,_stderr);
  }
  if (options->num_environment_variables != 0) {
    lVar4 = 8;
    uVar5 = 0;
    do {
      setenv(*(char **)((long)options->environment_variables + lVar4 + -8),
             *(char **)((long)&options->environment_variables->key + lVar4),1);
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x10;
    } while (uVar5 < options->num_environment_variables);
  }
  iVar1 = execv(*local_158,local_158);
  fprintf(_stderr,"Fossilize ERROR: Failed to start external process %s with execv.\n",
          options->external_replayer_path);
  if (iVar1 < 0) {
    exit(*piVar2);
  }
  exit(1);
}

Assistant:

void ExternalReplayer::Impl::start_replayer_process(const ExternalReplayer::Options &options, int ctl_fd)
{
	char fd_name[16], control_fd_name[16];
	sprintf(fd_name, "%d", fd);
	char num_thread_holder[16];

	std::string self_path;
	std::vector<const char *> argv;
	if (options.num_external_replayer_arguments)
	{
		for (unsigned i = 0; i < options.num_external_replayer_arguments; i++)
			argv.push_back(options.external_replayer_arguments[i]);
	}
	else if (options.external_replayer_path)
		argv.push_back(options.external_replayer_path);
	else
	{
#ifdef __linux__
		self_path = "/proc/self/exe";
#else
		self_path = Path::get_executable_path();
#endif
		argv.push_back(self_path.c_str());
	}

	for (unsigned i = 0; i < options.num_databases; i++)
		argv.push_back(options.databases[i]);

	argv.push_back("--master-process");
	if (options.quiet)
		argv.push_back("--quiet-slave");
	argv.push_back("--shmem-fd");
	argv.push_back(fd_name);

	if (ctl_fd >= 0)
	{
		argv.push_back("--control-fd");
		sprintf(control_fd_name, "%d", ctl_fd);
		argv.push_back(control_fd_name);
	}

	if (options.spirv_validate)
		argv.push_back("--spirv-val");

	if (options.num_threads)
	{
		argv.push_back("--num-threads");
		sprintf(num_thread_holder, "%u", options.num_threads);
		argv.push_back(num_thread_holder);
	}

	if (options.on_disk_pipeline_cache)
	{
		argv.push_back("--on-disk-pipeline-cache");
		argv.push_back(options.on_disk_pipeline_cache);
	}

	if (options.on_disk_validation_cache)
	{
		argv.push_back("--on-disk-validation-cache");
		argv.push_back(options.on_disk_validation_cache);
	}

	if (options.on_disk_validation_whitelist)
	{
		argv.push_back("--on-disk-validation-whitelist");
		argv.push_back(options.on_disk_validation_whitelist);
	}

	if (options.on_disk_validation_blacklist)
	{
		argv.push_back("--on-disk-validation-blacklist");
		argv.push_back(options.on_disk_validation_blacklist);
	}

	char whitelist_hex[9];
	if (options.on_disk_replay_whitelist)
	{
		argv.push_back("--on-disk-replay-whitelist");
		argv.push_back(options.on_disk_replay_whitelist);

		sprintf(whitelist_hex, "%x", options.on_disk_replay_whitelist_mask);
		argv.push_back("--on-disk-replay-whitelist-mask");
		argv.push_back(whitelist_hex);
	}

	if (options.on_disk_module_identifier)
	{
		argv.push_back("--on-disk-module-identifier");
		argv.push_back(options.on_disk_module_identifier);
	}

	if (options.replayer_cache_path)
	{
		argv.push_back("--replayer-cache");
		argv.push_back(options.replayer_cache_path);
	}

	if (options.enable_validation)
		argv.push_back("--enable-validation");

	if (options.disable_signal_handler)
		argv.push_back("--disable-signal-handler");
	if (options.disable_rate_limiter)
		argv.push_back("--disable-rate-limiter");

	if (options.null_device)
		argv.push_back("--null-device");

	argv.push_back("--device-index");
	char index_name[16];
	sprintf(index_name, "%u", options.device_index);
	argv.push_back(index_name);

	char graphics_range_start[16], graphics_range_end[16];
	char compute_range_start[16], compute_range_end[16];
	char raytracing_range_start[16], raytracing_range_end[16];

	if (options.use_pipeline_range)
	{
		argv.push_back("--graphics-pipeline-range");
		sprintf(graphics_range_start, "%u", options.start_graphics_index);
		sprintf(graphics_range_end, "%u", options.end_graphics_index);
		argv.push_back(graphics_range_start);
		argv.push_back(graphics_range_end);

		argv.push_back("--compute-pipeline-range");
		sprintf(compute_range_start, "%u", options.start_compute_index);
		sprintf(compute_range_end, "%u", options.end_compute_index);
		argv.push_back(compute_range_start);
		argv.push_back(compute_range_end);

		argv.push_back("--raytracing-pipeline-range");
		sprintf(raytracing_range_start, "%u", options.start_raytracing_index);
		sprintf(raytracing_range_end, "%u", options.end_raytracing_index);
		argv.push_back(raytracing_range_start);
		argv.push_back(raytracing_range_end);
	}

	if (options.pipeline_stats_path)
	{
		argv.push_back("--enable-pipeline-stats");
		argv.push_back(options.pipeline_stats_path);
	}

	char timeout[16];
	if (options.timeout_seconds)
	{
		argv.push_back("--timeout-seconds");
		sprintf(timeout, "%u", options.timeout_seconds);
		argv.push_back(timeout);
	}

	std::vector<std::array<char, 16>> implicit_indices;
	implicit_indices.resize(options.num_implicit_whitelist_indices);
	for (unsigned i = 0; i < options.num_implicit_whitelist_indices; i++)
	{
		argv.push_back("--implicit-whitelist");
		sprintf(implicit_indices[i].data(), "%u", options.implicit_whitelist_indices[i]);
		argv.push_back(implicit_indices[i].data());
	}

	argv.push_back(nullptr);

	if (options.quiet)
	{
		int null_fd = open("/dev/null", O_WRONLY);
		if (null_fd >= 0)
		{
			dup2(null_fd, STDOUT_FILENO);
			dup2(null_fd, STDERR_FILENO);
			close(null_fd);
		}
	}

	// Replayer should have idle priority.
	// nice() can return -1 in valid scenarios, need to check errno.
	errno = 0;

	if (!options.disable_rate_limiter)
	{
		if (nice(19) == -1 && errno != 0)
			LOGE("Failed to set nice value for external replayer!\n");
	}

#ifdef __linux__
	// Replayer crunches a lot of numbers, hint the scheduler.
	// This results in better throughput at the same or lower CPU usage (due
	// to better CPU cache utilization with bigger time slices), it doesn't
	// preempt interactive tasks (less impact on games), and it also makes a
	// better chance for the block layer to coalesce IO requests (more IO
	// may be dispatched per time slice).
	{
		struct sched_param p = {};
		if (sched_setscheduler(0, SCHED_BATCH, &p) < 0)
			LOGE("Failed to set scheduling policy for external replayer!\n");
	}

	if (!options.disable_rate_limiter)
	{
		// Hint the IO scheduler that we don't want a fair share of the disk
		// bandwidth.
		// https://www.kernel.org/doc/html/latest/block/ioprio.html
		if (ioprio_set(IOPRIO_WHO_PROCESS, 0, IOPRIO_PRIO_VALUE(IOPRIO_CLASS_IDLE, 0)) < 0)
			LOGE("Failed to set IO priority for external replayer!\n");
	}
#endif

#ifdef __APPLE__
	if (!options.disable_rate_limiter)
	{
		// Hint the IO scheduler that we don't want to impact foreground
		// latency.
		// https://www.unix.com/man-page/osx/3/setiopolicy_np/
		if (setiopolicy_np(IOPOL_TYPE_DISK, IOPOL_SCOPE_PROCESS, IOPOL_UTILITY) < 0)
			LOGE("Failed to set IO policy for external replayer!\n");
	}
#endif

	// We're now in the child process, so it's safe to override environment here.
	for (unsigned i = 0; i < options.num_environment_variables; i++)
		setenv(options.environment_variables[i].key, options.environment_variables[i].value, 1);

	if (execv(argv[0], const_cast<char * const*>(argv.data())) < 0)
	{
		LOGE("Failed to start external process %s with execv.\n", options.external_replayer_path);
		exit(errno);
	}
	else
	{
		LOGE("Failed to start external process %s with execv.\n", options.external_replayer_path);
		exit(1);
	}
}